

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_address.cpp
# Opt level: O0

bool __thiscall
cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
          (ElementsAddressFactory *this,ElementsConfidentialAddress *conf_addr,NetType net_type)

{
  bool bVar1;
  Address *in_RDI;
  NetType in_stack_ffffffffffffff0c;
  Address *in_stack_ffffffffffffff10;
  AddressFactory *in_stack_ffffffffffffff18;
  
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  bVar1 = AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  core::Address::~Address(in_RDI);
  return bVar1;
}

Assistant:

bool ElementsAddressFactory::CheckConfidentialAddressNetType(
    const ElementsConfidentialAddress& conf_addr, NetType net_type) const {
  return CheckAddressNetType(conf_addr.GetUnblindedAddress(), net_type);
}